

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

Expression * __thiscall
soul::heart::Parser::parseSuffixOperators(Parser *this,FunctionParseState *state,Expression *lhs)

{
  Module *pMVar1;
  char *__s1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Structure *this_00;
  StructElement *lhs_00;
  string *args;
  undefined4 extraout_var_01;
  Expression *pEVar5;
  int64_t iVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ArrayElement *lhs_01;
  int64_t end;
  string_view memberName;
  string member;
  Value constStart;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  Ptr local_100;
  undefined1 local_e0 [32];
  Ptr local_c0;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2838bd);
  if (bVar2) {
    readGeneralIdentifier_abi_cxx11_((string *)local_120,this);
    iVar3 = (*(lhs->super_Object)._vptr_Object[2])(lhs);
    if (*(char *)CONCAT44(extraout_var,iVar3) != '\x06') {
      CompileMessageHelpers::createMessage<>
                ((CompileMessage *)local_e0,syntax,error,"Invalid arguments for the dot operator");
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,local_e0);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_c0.object);
      if ((undefined1 *)CONCAT44(local_e0._4_4_,local_e0._0_4_) != local_e0 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_e0._4_4_,local_e0._0_4_),local_e0._16_8_ + 1);
      }
    }
    iVar3 = (*(lhs->super_Object)._vptr_Object[2])(lhs);
    this_00 = Type::getStructRef((Type *)CONCAT44(extraout_var_00,iVar3));
    memberName._M_str._4_4_ = local_120._4_4_;
    memberName._M_str._0_4_ = local_120._0_4_;
    memberName._M_len = local_120._8_8_;
    bVar2 = Structure::hasMemberWithName(this_00,memberName);
    if (bVar2) {
      pMVar1 = (this->module).object;
      if (pMVar1 == (Module *)0x0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      lhs_00 = PoolAllocator::
               allocate<soul::heart::StructElement,soul::CodeLocation&,soul::heart::Expression&,std::__cxx11::string&>
                         (&pMVar1->allocator->pool,
                          &(this->
                           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ).location,lhs,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_120);
      args = (string *)parseSuffixOperators(this,state,&lhs_00->super_Expression);
    }
    else {
      args = &this_00->name;
      CompileMessageHelpers::createMessage<std::__cxx11::string&,std::__cxx11::string_const&>
                ((CompileMessage *)local_e0,(CompileMessageHelpers *)0x1,none,0x289904,local_120,
                 args,in_stack_fffffffffffffed8);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,local_e0);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_c0.object);
      if ((undefined1 *)CONCAT44(local_e0._4_4_,local_e0._0_4_) != local_e0 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_e0._4_4_,local_e0._0_4_),local_e0._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_120._4_4_,local_120._0_4_) != &local_110) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_120._4_4_,local_120._0_4_),
                      local_110._M_allocated_capacity + 1);
    }
    if (bVar2) {
      return (Expression *)args;
    }
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2b016a);
  if (bVar2) {
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x2b0192);
    if (bVar2) {
      iVar4 = parseInt32(this);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x285ffb);
      lhs = parseArraySlice(this,state,lhs,0,(long)iVar4);
    }
    else {
      iVar3 = (*(lhs->super_Object)._vptr_Object[2])(lhs);
      pEVar5 = parseExpression(this,state);
      bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x2b0192);
      if (bVar2) {
        (*(pEVar5->super_Object)._vptr_Object[7])(local_e0,pEVar5);
        if ((1 < local_e0._4_4_ - int32) || (local_e0[0] != primitive)) {
          CompileMessageHelpers::createMessage<>
                    ((CompileMessage *)local_120,syntax,error,
                     "Expected a constant value for the array size");
          (*(this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            )._vptr_Tokeniser[2])(this,local_120);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_100.object);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_120._4_4_,local_120._0_4_) != &local_110) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_120._4_4_,local_120._0_4_),
                            local_110._M_allocated_capacity + 1);
          }
        }
        bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x285ffb);
        if (bVar2) {
          soul::Value::getData((PackedData *)local_120,(Value *)local_e0);
          iVar6 = soul::Value::PackedData::getAsInt64((PackedData *)local_120);
          if ((*(byte *)CONCAT44(extraout_var_01,iVar3) & 0xfe) != 2) {
            throwInternalCompilerError("isArrayOrVector()","getArrayOrVectorSize",0x137);
          }
          lhs = parseArraySlice(this,state,lhs,iVar6,
                                (long)*(int *)((byte *)CONCAT44(extraout_var_01,iVar3) + 8));
        }
        else {
          pEVar5 = parseExpression(this,state);
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::expect<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x285ffb);
          (*(pEVar5->super_Object)._vptr_Object[7])(local_120,pEVar5);
          if ((1 < local_120._4_4_ - int32) || (local_120[0] != primitive)) {
            CompileMessageHelpers::createMessage<>
                      (&local_a0,syntax,error,"Expected a constant value for the array size");
            (*(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              )._vptr_Tokeniser[2])(this,&local_a0);
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a0.location.sourceCode.object);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0.description._M_dataplus._M_p != &local_a0.description.field_2) {
              operator_delete(local_a0.description._M_dataplus._M_p,
                              local_a0.description.field_2._M_allocated_capacity + 1);
            }
          }
          soul::Value::getData((PackedData *)&local_a0,(Value *)local_e0);
          iVar6 = soul::Value::PackedData::getAsInt64((PackedData *)&local_a0);
          soul::Value::getData((PackedData *)&local_a0,(Value *)local_120);
          end = soul::Value::PackedData::getAsInt64((PackedData *)&local_a0);
          lhs = parseArraySlice(this,state,lhs,iVar6,end);
          soul::Value::~Value((Value *)local_120);
        }
        soul::Value::~Value((Value *)local_e0);
      }
      else {
        iVar3 = (*(pEVar5->super_Object)._vptr_Object[2])(pEVar5);
        if (((1 < *(int *)((char *)CONCAT44(extraout_var_02,iVar3) + 4) - 7U) ||
            (*(char *)CONCAT44(extraout_var_02,iVar3) != '\x01')) &&
           (iVar3 = (*(pEVar5->super_Object)._vptr_Object[2])(pEVar5),
           (*(byte *)CONCAT44(extraout_var_03,iVar3) & 0xfe) != 4)) {
          CompileMessageHelpers::createMessage<>
                    ((CompileMessage *)local_e0,syntax,error,
                     "An array index must be an integer type");
          (*(this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            )._vptr_Tokeniser[2])(this,(CompileMessage *)local_e0);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_c0.object);
          if ((undefined1 *)CONCAT44(local_e0._4_4_,local_e0._0_4_) != local_e0 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_e0._4_4_,local_e0._0_4_),
                            local_e0._16_8_ + 1);
          }
        }
        __s1 = (this->
               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ).currentType.text;
        if ((__s1 == "]]") || ((__s1 != (char *)0x0 && (iVar3 = strcmp(__s1,"]]"), iVar3 == 0)))) {
          (this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ).currentType.text = "]";
        }
        else {
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::expect<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x285ffb);
          iVar3 = (*(lhs->super_Object)._vptr_Object[2])(lhs);
          if ((*(byte *)CONCAT44(extraout_var_04,iVar3) & 0xfe) != 2) {
            CompileMessageHelpers::createMessage<>
                      (&local_68,syntax,error,"Expected an array or vector type");
            CodeLocation::throwError
                      (&(this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ).location,&local_68);
          }
        }
        pMVar1 = (this->module).object;
        if (pMVar1 == (Module *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        lhs_01 = PoolAllocator::
                 allocate<soul::heart::ArrayElement,soul::CodeLocation&,soul::heart::Expression&,soul::heart::Expression&>
                           (&pMVar1->allocator->pool,
                            &(this->
                             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                             ).location,lhs,pEVar5);
        lhs = parseSuffixOperators(this,state,&lhs_01->super_Expression);
      }
    }
  }
  return lhs;
}

Assistant:

heart::Expression& parseSuffixOperators (const FunctionParseState& state, heart::Expression& lhs)
    {
        if (matchIf (HEARTOperator::dot))
        {
            auto member = readGeneralIdentifier();

            if (! lhs.getType().isStruct())
                throwError (Errors::invalidDotArguments());

            auto& structure = lhs.getType().getStructRef();

            if (structure.hasMemberWithName (member))
                return parseSuffixOperators (state, module->allocate<heart::StructElement> (location, lhs, member));

            throwError (Errors::unknownMemberInStruct (member, structure.getName()));
        }

        if (matchIf (HEARTOperator::openBracket))
        {
            if (matchIf (HEARTOperator::colon))
            {
                auto endIndex = parseInt32();
                expect (HEARTOperator::closeBracket);
                return parseArraySlice (state, lhs, 0, endIndex);
            }

            const auto& arrayOrVectorType = lhs.getType();

            auto& startIndex = parseExpression (state);

            if (matchIf (HEARTOperator::colon))
            {
                auto constStart = startIndex.getAsConstant();

                if (! constStart.getType().isPrimitiveInteger())
                    throwError (Errors::nonConstArraySize());

                if (matchIf (HEARTOperator::closeBracket))
                    return parseArraySlice (state, lhs, constStart.getAsInt64(),
                                            (int64_t) arrayOrVectorType.getArrayOrVectorSize());

                auto& endIndex = parseExpression (state);
                expect (HEARTOperator::closeBracket);

                auto constEnd = endIndex.getAsConstant();

                if (! constEnd.getType().isPrimitiveInteger())
                    throwError (Errors::nonConstArraySize());

                return parseArraySlice (state, lhs, constStart.getAsInt64(), constEnd.getAsInt64());
            }

            if (! (startIndex.getType().isPrimitiveInteger() || startIndex.getType().isBoundedInt()))
                throwError (Errors::nonIntegerArrayIndex());

            if (matchAndReplaceIf (HEARTOperator::closeDoubleBracket, HEARTOperator::closeBracket))
                return parseSuffixOperators (state, module->allocate<heart::ArrayElement> (location, lhs, startIndex));

            expect (HEARTOperator::closeBracket);

            if (! lhs.getType().isArrayOrVector())
                location.throwError (Errors::expectedArrayOrVector());

            return parseSuffixOperators (state, module->allocate<heart::ArrayElement> (location, lhs, startIndex));
        }

        return lhs;
    }